

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O1

PolicyPoolInterface * __thiscall
PolicyPoolJPolValPair::operator=(PolicyPoolJPolValPair *this,PolicyPoolInterface *o)

{
  PolicyPoolJPolValPair *o_00;
  
  if (this != (PolicyPoolJPolValPair *)o) {
    o_00 = (PolicyPoolJPolValPair *)__dynamic_cast(o,&PolicyPoolInterface::typeinfo,&typeinfo,0);
    if (o_00 == (PolicyPoolJPolValPair *)0x0) {
      __cxa_bad_cast();
    }
    operator=(this,o_00);
  }
  return &this->super_PolicyPoolInterface;
}

Assistant:

PolicyPoolInterface& PolicyPoolJPolValPair::operator= 
    (const PolicyPoolInterface& o)
{
    if(DEBUG_PPJPVP_ASSIGN)
        cout <<"PolicyPoolInterface& PolicyPoolJPolValPair::operator= \
called."<<endl;
    if (this == &o) return *this;   // Gracefully handle self assignment
    const PolicyPoolJPolValPair& casted_o = 
        dynamic_cast<const PolicyPoolJPolValPair&>(o);

    return(operator=(casted_o));

}